

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *s,int *plits,int nlits,int pivot)

{
  vec<int> *this;
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  uint nlits_00;
  ulong uVar6;
  uint local_44;
  
  if (pivot < 0) {
    __assert_fail("pivot >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                  ,0x101,
                  "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
  }
  while( true ) {
    nlits_00 = nlits;
    uVar3 = nlits_00 - pivot;
    if (uVar3 == 0 || (int)nlits_00 < pivot) {
      __assert_fail("nlits - pivot >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/AbcGlucose.cpp"
                    ,0x103,
                    "int bmcg_sat_solver_minimize_assumptions(bmcg_sat_solver *, int *, int, int)");
    }
    if (uVar3 == 1) break;
    uVar5 = uVar3 >> 1;
    nlits = uVar5 + pivot;
    iVar1 = glucose_solver_solve((SimpSolver *)s,plits,nlits);
    if (iVar1 != -1) {
      this = (vec<int> *)((long)s + 0x38);
      local_44 = 1;
      if (uVar3 - uVar5 != 1) {
        local_44 = bmcg_sat_solver_minimize_assumptions(s,plits,nlits_00,nlits);
      }
      if (this->data != (int *)0x0) {
        *(undefined4 *)((long)s + 0x40) = 0;
      }
      uVar6 = (ulong)uVar5;
      piVar4 = plits + (uint)pivot;
      do {
        Gluco::vec<int>::push(this,piVar4);
        piVar4 = piVar4 + 1;
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      if (0 < (int)local_44) {
        uVar6 = 0;
        do {
          plits[(uint)pivot + uVar6] = plits[(uint)nlits + uVar6];
          uVar6 = uVar6 + 1;
        } while (local_44 != uVar6);
      }
      piVar4 = this->data;
      iVar1 = pivot + local_44;
      uVar6 = 0;
      do {
        plits[(long)iVar1 + uVar6] = piVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 + (uVar5 == 0) != uVar6);
      iVar2 = glucose_solver_solve((SimpSolver *)s,plits,iVar1);
      if (iVar2 != -1) {
        iVar2 = 1;
        if (uVar5 != 1) {
          iVar2 = bmcg_sat_solver_minimize_assumptions(s,plits,uVar5 + iVar1,iVar1);
        }
        local_44 = local_44 + iVar2;
      }
      return local_44;
    }
  }
  iVar1 = glucose_solver_solve((SimpSolver *)s,plits,pivot);
  return (uint)(iVar1 != -1);
}

Assistant:

int bmcg_sat_solver_minimize_assumptions( bmcg_sat_solver * s, int * plits, int nlits, int pivot )
{
    vec<int>*array = &((Gluco::SimpSolver*)s)->user_vec;
    int i, nlitsL, nlitsR, nresL, nresR, status;
    assert( pivot >= 0 );
//    assert( nlits - pivot >= 2 );
    assert( nlits - pivot >= 1 );
    if ( nlits - pivot == 1 )
    {
        // since the problem is UNSAT, we try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        status = bmcg_sat_solver_solve( s, plits, pivot );
        return status != GLUCOSE_UNSAT; // return 1 if the problem is not UNSAT
    }
    assert( nlits - pivot >= 2 );
    nlitsL = (nlits - pivot) / 2;
    nlitsR = (nlits - pivot) - nlitsL;
    assert( nlitsL + nlitsR == nlits - pivot );
    // solve with these assumptions
    status = bmcg_sat_solver_solve( s, plits, pivot + nlitsL );
    if ( status == GLUCOSE_UNSAT ) // these are enough
        return bmcg_sat_solver_minimize_assumptions( s, plits, pivot + nlitsL, pivot );
    // these are not enough
    // solve for the right lits
//    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    nresL = nlitsR == 1 ? 1 : bmcg_sat_solver_minimize_assumptions( s, plits, nlits, pivot + nlitsL );
    // swap literals
    array->clear();
    for ( i = 0; i < nlitsL; i++ )
        array->push(plits[pivot + i]);
    for ( i = 0; i < nresL; i++ )
        plits[pivot + i] = plits[pivot + nlitsL + i];
    for ( i = 0; i < nlitsL; i++ )
        plits[pivot + nresL + i] = (*array)[i];
    // solve with these assumptions
    status = bmcg_sat_solver_solve( s, plits, pivot + nresL );
    if ( status == GLUCOSE_UNSAT ) // these are enough
        return nresL;
    // solve for the left lits
//    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    nresR = nlitsL == 1 ? 1 : bmcg_sat_solver_minimize_assumptions( s, plits, pivot + nresL + nlitsL, pivot + nresL );
    return nresL + nresR;
}